

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# late_materialization.cpp
# Opt level: O1

void __thiscall
duckdb::LateMaterialization::ReplaceExpressionReferences
          (LateMaterialization *this,LogicalOperator *next_op,
          unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> *expr)

{
  _Head_base<0UL,_duckdb::Expression_*,_false> _Var1;
  undefined8 uVar2;
  pointer pEVar3;
  type expr_00;
  pointer *__ptr;
  LogicalOperator *op;
  _Any_data local_38;
  code *local_28;
  code *pcStack_20;
  
  op = next_op;
  pEVar3 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::operator->
                     (expr);
  if ((pEVar3->super_BaseExpression).type == BOUND_COLUMN_REF) {
    pEVar3 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
             operator->(expr);
    BaseExpression::Cast<duckdb::BoundColumnRefExpression>(&pEVar3->super_BaseExpression);
    GetExpression((LateMaterialization *)&local_38,op,(idx_t)next_op);
    uVar2 = local_38._M_unused._0_8_;
    local_38._M_unused._M_object = (long *)0x0;
    _Var1._M_head_impl =
         (expr->super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>)._M_t
         .super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>._M_t.
         super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>.
         super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl;
    (expr->super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>)._M_t.
    super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>._M_t.
    super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>.
    super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl = (Expression *)uVar2;
    if (_Var1._M_head_impl != (Expression *)0x0) {
      (**(code **)(*(long *)&(_Var1._M_head_impl)->super_BaseExpression + 8))();
    }
    if ((long *)local_38._M_unused._0_8_ != (long *)0x0) {
      (**(code **)(*local_38._M_unused._M_object + 8))();
    }
  }
  else {
    expr_00 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
              operator*(expr);
    pcStack_20 = ::std::
                 _Function_handler<void_(duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/duckdb[P]duckdb/src/optimizer/late_materialization.cpp:177:13)>
                 ::_M_invoke;
    local_28 = ::std::
               _Function_handler<void_(duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/duckdb[P]duckdb/src/optimizer/late_materialization.cpp:177:13)>
               ::_M_manager;
    local_38._M_unused._M_object = this;
    local_38._8_8_ = next_op;
    ExpressionIterator::EnumerateChildren
              (expr_00,(function<void_(duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_&)>
                        *)&local_38);
    if (local_28 != (code *)0x0) {
      (*local_28)(&local_38,&local_38,__destroy_functor);
    }
  }
  return;
}

Assistant:

void LateMaterialization::ReplaceExpressionReferences(LogicalOperator &next_op, unique_ptr<Expression> &expr) {
	if (expr->GetExpressionType() == ExpressionType::BOUND_COLUMN_REF) {
		auto &bound_column_ref = expr->Cast<BoundColumnRefExpression>();
		expr = GetExpression(next_op, bound_column_ref.binding.column_index);
		return;
	}

	ExpressionIterator::EnumerateChildren(
	    *expr, [&](unique_ptr<Expression> &child) { ReplaceExpressionReferences(next_op, child); });
}